

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O0

void __thiscall kratos::EventTracingStmt::~EventTracingStmt(EventTracingStmt *this)

{
  EventTracingStmt *this_local;
  
  (this->super_AuxiliaryStmt).super_Stmt.super_IRNode._vptr_IRNode =
       (_func_int **)&PTR_accept_00588d48;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::~map(&this->match_values_);
  std::__cxx11::string::~string((string *)&this->transaction_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::~map(&this->event_fields_);
  std::__cxx11::string::~string((string *)&this->event_name_);
  AuxiliaryStmt::~AuxiliaryStmt(&this->super_AuxiliaryStmt);
  return;
}

Assistant:

void add_event_field(const std::string &name, const std::shared_ptr<Var> &var) {
        event_fields_.emplace(name, var);
    }